

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

int __thiscall kj::EventLoop::poll(EventLoop *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  Event *this_00;
  uint uVar1;
  EventPort *pEVar2;
  Own<kj::Executor,_std::nullptr_t> *pOVar3;
  Executor *pEVar4;
  EventLoop *extraout_RAX;
  nfds_t __nfds_00;
  nfds_t __nfds_01;
  Event *event;
  Own<kj::Executor,_std::nullptr_t> *e_1;
  Own<kj::Executor,_std::nullptr_t> *_e1909;
  Own<kj::Executor,_std::nullptr_t> *e;
  Own<kj::Executor,_std::nullptr_t> *_e1905;
  EventPort *p;
  EventPort *_p1902;
  EventLoop *this_local;
  
  pEVar2 = kj::_::readMaybe<kj::EventPort>(&this->port);
  if (pEVar2 == (EventPort *)0x0) {
    pOVar3 = kj::_::readMaybe<kj::Executor,decltype(nullptr)>(&this->executor);
    if (pOVar3 != (Own<kj::Executor,_std::nullptr_t> *)0x0) {
      pEVar4 = Own<kj::Executor,_std::nullptr_t>::operator->(pOVar3);
      Executor::poll(pEVar4,__fds,__nfds_01,__timeout);
    }
  }
  else {
    uVar1 = (*pEVar2->_vptr_EventPort[1])();
    if (((uVar1 & 1) != 0) &&
       (pOVar3 = kj::_::readMaybe<kj::Executor,decltype(nullptr)>(&this->executor),
       pOVar3 != (Own<kj::Executor,_std::nullptr_t> *)0x0)) {
      pEVar4 = Own<kj::Executor,_std::nullptr_t>::operator->(pOVar3);
      Executor::poll(pEVar4,__fds,__nfds_00,__timeout);
    }
  }
  if ((this->head == (Event *)0x0) && (this->wouldSleepHead != (Event *)0x0)) {
    this_00 = this->wouldSleepHead;
    kj::_::Event::disarm(this_00);
    kj::_::Event::armDepthFirst(this_00);
    this = extraout_RAX;
  }
  return (int)this;
}

Assistant:

void EventLoop::poll() {
  KJ_IF_SOME(p, port) {
    if (p.poll()) {
      // Another thread called wake(). Check for cross-thread events.
      KJ_IF_SOME(e, executor) {
        e->poll();
      }
    }
  } else KJ_IF_SOME(e, executor) {
    e->poll();
  }

  if (head == nullptr && wouldSleepHead != nullptr) {
    // We got nothing by polling. So, enqueue the next would-sleep event instead.
    _::Event* event = wouldSleepHead;
    event->disarm();
    event->armDepthFirst();
  }
}